

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

ggml_tensor * __thiscall llm_graph_context::build_inp_cross_embd(llm_graph_context *this)

{
  bool bVar1;
  pointer plVar2;
  ggml_tensor *pgVar3;
  pointer this_00;
  long in_RDI;
  int64_t n_enc;
  int64_t n_embd;
  ggml_tensor **cur;
  __single_object inp;
  llm_graph_input_ptr *in_stack_ffffffffffffff88;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffa0;
  llama_cross **in_stack_ffffffffffffffa8;
  ulong local_50;
  unique_ptr<llm_graph_input_cross_embd,_std::default_delete<llm_graph_input_cross_embd>_>
  local_40 [3];
  ulong local_28;
  ulong local_20;
  ggml_tensor **local_18;
  
  std::make_unique<llm_graph_input_cross_embd,llama_cross_const*const&>(in_stack_ffffffffffffffa8);
  plVar2 = std::
           unique_ptr<llm_graph_input_cross_embd,_std::default_delete<llm_graph_input_cross_embd>_>
           ::operator->((unique_ptr<llm_graph_input_cross_embd,_std::default_delete<llm_graph_input_cross_embd>_>
                         *)0x43502e);
  local_18 = &plVar2->cross_embd;
  bVar1 = std::vector<float,_std::allocator<float>_>::empty(in_stack_ffffffffffffffa0);
  if (bVar1) {
    local_50 = (ulong)*(uint *)(*(long *)(in_RDI + 8) + 8);
  }
  else {
    local_50 = **(ulong **)(in_RDI + 0xf0);
  }
  local_20 = local_50;
  bVar1 = std::vector<float,_std::allocator<float>_>::empty(in_stack_ffffffffffffffa0);
  if (bVar1) {
    local_28 = (ulong)*(uint *)(*(long *)(in_RDI + 8) + 4);
  }
  else {
    local_28 = *(ulong *)(*(long *)(in_RDI + 0xf0) + 8);
  }
  pgVar3 = (ggml_tensor *)ggml_new_tensor_2d(*(undefined8 *)(in_RDI + 0xc0),0,local_20,local_28);
  *local_18 = pgVar3;
  ggml_set_input(*local_18);
  this_00 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x435120);
  std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>::
  unique_ptr<llm_graph_input_cross_embd,std::default_delete<llm_graph_input_cross_embd>,void>
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)pgVar3,
             local_40);
  llm_graph_result::add_input(this_00,in_stack_ffffffffffffff88);
  std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>::~unique_ptr
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)this_00);
  pgVar3 = *local_18;
  std::unique_ptr<llm_graph_input_cross_embd,_std::default_delete<llm_graph_input_cross_embd>_>::
  ~unique_ptr((unique_ptr<llm_graph_input_cross_embd,_std::default_delete<llm_graph_input_cross_embd>_>
               *)this_00);
  return pgVar3;
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_cross_embd() const {
    auto inp = std::make_unique<llm_graph_input_cross_embd>(cross);

    auto & cur = inp->cross_embd;

    // if we have the output embeddings from the encoder, use them directly
    // TODO: needs more work to be correct, for now just use the tensor shape
    //if (cross->t_embd) {
    //    cur = ggml_view_tensor(ctx0, cross->t_embd);

    //    return cur;
    //}

    const auto n_embd = !cross->v_embd.empty() ? cross->n_embd : hparams.n_embd;
    const auto n_enc  = !cross->v_embd.empty() ? cross->n_enc : hparams.n_ctx_train;

    cur = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_embd, n_enc);
    ggml_set_input(cur);

    res->add_input(std::move(inp));

    return cur;
}